

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

VP8StatusCode ParseRIFF(uint8_t **data,size_t *data_size,int have_all_data,size_t *riff_size)

{
  uint32_t uVar1;
  ulong *in_RCX;
  int in_EDX;
  ulong *in_RSI;
  long *in_RDI;
  uint32_t size;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  *in_RCX = 0;
  if ((0xb < *in_RSI) && (*(int *)*in_RDI == 0x46464952)) {
    if (*(int *)(*in_RDI + 8) != 0x50424557) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    uVar1 = GetLE32((uint8_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (uVar1 < 0xc) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (0xfffffff6 < uVar1) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if ((in_EDX != 0) && (*in_RSI - 8 < (ulong)uVar1)) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    *in_RCX = (ulong)uVar1;
    *in_RDI = *in_RDI + 0xc;
    *in_RSI = *in_RSI - 0xc;
  }
  return VP8_STATUS_OK;
}

Assistant:

static VP8StatusCode ParseRIFF(const uint8_t** const data,
                               size_t* const data_size, int have_all_data,
                               size_t* const riff_size) {
  assert(data != NULL);
  assert(data_size != NULL);
  assert(riff_size != NULL);

  *riff_size = 0;  // Default: no RIFF present.
  if (*data_size >= RIFF_HEADER_SIZE && !memcmp(*data, "RIFF", TAG_SIZE)) {
    if (memcmp(*data + 8, "WEBP", TAG_SIZE)) {
      return VP8_STATUS_BITSTREAM_ERROR;  // Wrong image file signature.
    } else {
      const uint32_t size = GetLE32(*data + TAG_SIZE);
      // Check that we have at least one chunk (i.e "WEBP" + "VP8?nnnn").
      if (size < TAG_SIZE + CHUNK_HEADER_SIZE) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
      if (size > MAX_CHUNK_PAYLOAD) {
        return VP8_STATUS_BITSTREAM_ERROR;
      }
      if (have_all_data && (size > *data_size - CHUNK_HEADER_SIZE)) {
        return VP8_STATUS_NOT_ENOUGH_DATA;  // Truncated bitstream.
      }
      // We have a RIFF container. Skip it.
      *riff_size = size;
      *data += RIFF_HEADER_SIZE;
      *data_size -= RIFF_HEADER_SIZE;
    }
  }
  return VP8_STATUS_OK;
}